

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_fd2uuid(int fd)

{
  long lStack_10;
  int fd_local;
  
  if ((fd < 0) || ((ulong)fio_data->capa <= (ulong)(long)fd)) {
    lStack_10 = -1;
  }
  else {
    if (*(char *)((long)fio_data + (long)fd * 0xa8 + 0x6f) == '\0') {
      fio_lock((fio_lock_i *)((long)fio_data + (long)fd * 0xa8 + 0x6c));
      fio_clear_fd((long)fd,'\x01');
      fio_unlock((fio_lock_i *)((long)fio_data + (long)fd * 0xa8 + 0x6c));
    }
    lStack_10 = (long)CONCAT41(fd,*(undefined1 *)((long)fio_data + (long)fd * 0xa8 + 0x6d));
  }
  return lStack_10;
}

Assistant:

intptr_t fio_fd2uuid(int fd) {
  if (fd < 0 || (size_t)fd >= fio_data->capa)
    return -1;
  if (!fd_data(fd).open) {
    fio_lock(&fd_data(fd).protocol_lock);
    fio_clear_fd(fd, 1);
    fio_unlock(&fd_data(fd).protocol_lock);
  }
  return fd2uuid(fd);
}